

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O3

SUNNonlinearSolver SUNNonlinSol_FixedPointSens(int count,N_Vector y,int m,SUNContext sunctx)

{
  N_Vector y_00;
  SUNNonlinearSolver p_Var1;
  
  y_00 = N_VNew_SensWrapper(count,y);
  p_Var1 = SUNNonlinSol_FixedPoint(y_00,m,sunctx);
  N_VDestroy(y_00);
  return p_Var1;
}

Assistant:

SUNNonlinearSolver SUNNonlinSol_FixedPointSens(int count, N_Vector y, int m,
                                               SUNContext sunctx)
{
  SUNNonlinearSolver NLS;
  N_Vector w;

  /* create sensitivity vector wrapper */
  w = N_VNew_SensWrapper(count, y);

  /* create nonlinear solver using sensitivity vector wrapper */
  NLS = SUNNonlinSol_FixedPoint(w, m, sunctx);

  /* free sensitivity vector wrapper */
  N_VDestroy(w);

  /* return NLS object */
  return(NLS);
}